

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

void __thiscall BackwardPass::ProcessLoop(BackwardPass *this,BasicBlock *lastBlock)

{
  code *pcVar1;
  FlowEdge **this_00;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *this_01;
  Type_conflict node;
  undefined4 *puVar3;
  JitArenaAllocator *pJVar4;
  Type this_02;
  BVSparse<Memory::JitArenaAllocator> *pBVar5;
  BasicBlock *local_118;
  BasicBlock *block;
  BasicBlock *blockStop;
  TrackAllocData local_f8;
  code *local_d0;
  undefined8 local_c8;
  TrackAllocData local_c0;
  BasicBlock *local_98;
  BasicBlock *blockSucc;
  FlowEdge **__edge;
  Iterator __iter;
  TrackAllocData local_68;
  BVSparse<Memory::JitArenaAllocator> *local_40;
  BVSparse<Memory::JitArenaAllocator> *bv;
  Func *pFStack_30;
  bool prevIsLoopPrepass;
  Loop *loop;
  BasicBlock *lastBlock_local;
  BackwardPass *this_local;
  bool local_9;
  
  loop = (Loop *)lastBlock;
  lastBlock_local = (BasicBlock *)this;
  bVar2 = IsTraceEnabled(this);
  if (bVar2) {
    Output::Print(L"******* PREPASS START ********\n");
  }
  pFStack_30 = loop->topFunc;
  bv._7_1_ = this->isLoopPrepass & 1;
  this->isLoopPrepass = true;
  sourceContextId = Func::GetSourceContextId(this->func);
  functionId = Func::GetLocalFunctionId(this->func);
  bVar2 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01eb5b30,LiveOutFieldsPhase,sourceContextId,functionId);
  if ((bVar2) &&
     ((bVar2 = GlobOpt::DoFieldOpts(this->globOpt,(Loop *)pFStack_30), bVar2 ||
      (bVar2 = GlobOpt::DoFieldRefOpts(this->globOpt,(Loop *)pFStack_30), bVar2)))) {
    pJVar4 = this->func->m_fg->alloc;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_68,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
               0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
               ,0x665);
    pJVar4 = (JitArenaAllocator *)
             Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            pJVar4,&local_68);
    __iter.current = (NodeBase *)Memory::JitArenaAllocator::Alloc;
    pBVar5 = (BVSparse<Memory::JitArenaAllocator> *)
             new<Memory::JitArenaAllocator>(0x20,pJVar4,0x4e98c0);
    BVSparse<Memory::JitArenaAllocator>::BVSparse(pBVar5,this->func->m_fg->alloc);
    local_40 = pBVar5;
    this_01 = &BasicBlock::GetSuccList((BasicBlock *)loop)->
               super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
    ___edge = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::GetIterator(this_01);
    while( true ) {
      this_local = (BackwardPass *)&__edge;
      if (__iter.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      this_00 = __edge;
      node = SListNodeBase<Memory::ArenaAllocator>::Next
                       (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      bVar2 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                        ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)this_00,node);
      if (!bVar2) {
        SListNodeBase<Memory::ArenaAllocator>::Next
                  (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      }
      local_9 = !bVar2;
      if (!local_9) break;
      blockSucc = (BasicBlock *)
                  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                            ((Iterator *)&__edge);
      local_98 = FlowEdge::GetSucc((FlowEdge *)blockSucc->next);
      if (local_98 == (BasicBlock *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x666,"(blockSucc)","blockSucc");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      if ((Func *)local_98->loop != pFStack_30) {
        if ((local_98->loop != (Loop *)0x0) &&
           ((*(ushort *)&local_98->loop->field_0x178 >> 2 & 1) == 0)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar3 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x66d,"(!blockSucc->loop || blockSucc->loop->hasDeadStorePrepass)",
                             "!blockSucc->loop || blockSucc->loop->hasDeadStorePrepass");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar3 = 0;
        }
        BVSparse<Memory::JitArenaAllocator>::Or(local_40,local_98->upwardExposedFields);
      }
    }
    *(BVSparse<Memory::JitArenaAllocator> **)&loop->topFunc->m_savedRegSize = local_40;
  }
  if ((this->tag == DeadStorePhase) &&
     ((*(ushort *)((long)(pFStack_30->m_prologEncoder).buffer + 0x58) >> 1 & 1) == 0)) {
    bVar2 = IsCollectionPass(this);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x679,"(!IsCollectionPass())","!IsCollectionPass()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    bVar2 = IsPrePass(this);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x67a,"(!IsPrePass())","!IsPrePass()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    this->isCollectionPass = true;
    ProcessLoopCollectionPass(this,(BasicBlock *)loop);
    this->isCollectionPass = false;
  }
  bVar2 = IsPrePass(this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x680,"(!this->IsPrePass())","!this->IsPrePass()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this->currentPrePassLoop = (Loop *)pFStack_30;
  if (this->tag == BackwardPhase) {
    if ((pFStack_30->lazyBailoutProperties).
        super_BaseDictionary<int,_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
        .stats != (Type)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x685,"(loop->symsAssignedToInLoop == nullptr)",
                         "loop->symsAssignedToInLoop == nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    pJVar4 = this->globOpt->alloc;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_c0,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
               0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
               ,0x686);
    pJVar4 = (JitArenaAllocator *)
             Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            pJVar4,&local_c0);
    local_d0 = Memory::JitArenaAllocator::Alloc;
    local_c8 = 0;
    this_02 = (Type)new<Memory::JitArenaAllocator>(0x20,pJVar4,0x4e98c0);
    BVSparse<Memory::JitArenaAllocator>::BVSparse
              ((BVSparse<Memory::JitArenaAllocator> *)this_02,this->globOpt->alloc);
    (pFStack_30->lazyBailoutProperties).
    super_BaseDictionary<int,_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    .stats = this_02;
    if (*(BVSparse<Memory::JitArenaAllocator> **)&pFStack_30->anyPropertyMayBeWrittenTo !=
        (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x687,"(loop->preservesNumberValue == nullptr)",
                         "loop->preservesNumberValue == nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    pJVar4 = this->globOpt->alloc;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_f8,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
               0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
               ,0x688);
    pJVar4 = (JitArenaAllocator *)
             Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            pJVar4,&local_f8);
    pBVar5 = (BVSparse<Memory::JitArenaAllocator> *)
             new<Memory::JitArenaAllocator>(0x20,pJVar4,0x4e98c0);
    BVSparse<Memory::JitArenaAllocator>::BVSparse(pBVar5,this->globOpt->alloc);
    *(BVSparse<Memory::JitArenaAllocator> **)&pFStack_30->anyPropertyMayBeWrittenTo = pBVar5;
  }
  for (local_118 = (BasicBlock *)loop;
      (local_118 != (BasicBlock *)0x0 &&
      (((((*(ushort *)&local_118->field_0x18 & 1) != 0 &&
         ((*(ushort *)&local_118->field_0x18 >> 1 & 1) == 0)) ||
        (ProcessBlock(this,local_118), (*(ushort *)&local_118->field_0x18 >> 2 & 1) == 0)) ||
       ((Func *)local_118->loop != loop->topFunc)))); local_118 = local_118->prev) {
  }
  this->currentPrePassLoop = (Loop *)0x0;
  if (loop == (Loop *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x697,"(lastBlock)","lastBlock");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  *(ushort *)((loop->topFunc->m_prologEncoder).buffer + 0x58) =
       *(ushort *)((loop->topFunc->m_prologEncoder).buffer + 0x58) & 0xfffb | 4;
  this->isLoopPrepass = (bool)(bv._7_1_ & 1);
  bVar2 = IsTraceEnabled(this);
  if (bVar2) {
    Output::Print(L"******** PREPASS END *********\n");
  }
  return;
}

Assistant:

void
BackwardPass::ProcessLoop(BasicBlock * lastBlock)
{
#if DBG_DUMP
    if (this->IsTraceEnabled())
    {
        Output::Print(_u("******* PREPASS START ********\n"));
    }
#endif

    Loop *loop = lastBlock->loop;

    bool prevIsLoopPrepass = this->isLoopPrepass;
    this->isLoopPrepass = true;

    // This code doesn't work quite as intended. It is meant to capture fields that are live out of a loop to limit the
    // number of implicit call bailouts the forward pass must create (only compiler throughput optimization, no impact
    // on emitted code), but because it looks only at the lexically last block in the loop, it does the right thing only
    // for do-while loops. For other loops (for and while) the last block does not exit the loop. Even for do-while loops
    // this tracking can have the adverse effect of killing fields that should stay live after copy prop. Disabled by default.
    // Left in under a flag, in case we find compiler throughput issues and want to do additional experiments.
    if (PHASE_ON(Js::LiveOutFieldsPhase, this->func))
    {
        if (this->globOpt->DoFieldOpts(loop) || this->globOpt->DoFieldRefOpts(loop))
        {
            // Get the live-out set at the loop bottom.
            // This may not be the only loop exit, but all loop exits either leave the function or pass through here.
            // In the forward pass, we'll use this set to trim the live fields on exit from the loop
            // in order to limit the number of bailout points following the loop.
            BVSparse<JitArenaAllocator> *bv = JitAnew(this->func->m_fg->alloc, BVSparse<JitArenaAllocator>, this->func->m_fg->alloc);
            FOREACH_SUCCESSOR_BLOCK(blockSucc, lastBlock)
            {
                if (blockSucc->loop != loop)
                {
                    // Would like to assert this, but in strange exprgen cases involving "break LABEL" in nested
                    // loops the loop graph seems to get confused.
                    //Assert(!blockSucc->loop || blockSucc->loop->IsDescendentOrSelf(loop));
                    Assert(!blockSucc->loop || blockSucc->loop->hasDeadStorePrepass);

                    bv->Or(blockSucc->upwardExposedFields);
                }
            }
            NEXT_SUCCESSOR_BLOCK;
            lastBlock->loop->liveOutFields = bv;
        }
    }

    if(tag == Js::DeadStorePhase && !loop->hasDeadStoreCollectionPass)
    {
        Assert(!IsCollectionPass());
        Assert(!IsPrePass());
        isCollectionPass = true;
        ProcessLoopCollectionPass(lastBlock);
        isCollectionPass = false;
    }

    Assert(!this->IsPrePass());
    this->currentPrePassLoop = loop;

    if (tag == Js::BackwardPhase)
    {
        Assert(loop->symsAssignedToInLoop == nullptr);
        loop->symsAssignedToInLoop = JitAnew(this->globOpt->alloc, BVSparse<JitArenaAllocator>, this->globOpt->alloc);
        Assert(loop->preservesNumberValue == nullptr);
        loop->preservesNumberValue = JitAnew(this->globOpt->alloc, BVSparse<JitArenaAllocator>, this->globOpt->alloc);
    }

    FOREACH_BLOCK_BACKWARD_IN_RANGE_DEAD_OR_ALIVE(block, lastBlock, nullptr)
    {
        this->ProcessBlock(block);

        if (block->isLoopHeader && block->loop == lastBlock->loop)
        {
            break;
        }
    }
    NEXT_BLOCK_BACKWARD_IN_RANGE_DEAD_OR_ALIVE;

    this->currentPrePassLoop = nullptr;
    Assert(lastBlock);
    __analysis_assume(lastBlock);
    lastBlock->loop->hasDeadStorePrepass = true;

    this->isLoopPrepass = prevIsLoopPrepass;

#if DBG_DUMP
    if (this->IsTraceEnabled())
    {
        Output::Print(_u("******** PREPASS END *********\n"));
    }
#endif
}